

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O3

ManagedType __thiscall cmGeneratorTarget::GetManagedType(cmGeneratorTarget *this,string *config)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  TargetType TVar3;
  ImportInfo *pIVar4;
  char *__s;
  size_t sVar5;
  ManagedType MVar6;
  string local_40;
  
  TVar3 = cmTarget::GetType(this->Target);
  MVar6 = Undefined;
  if ((int)TVar3 < 3) {
    TVar3 = cmTarget::GetType(this->Target);
    MVar6 = Native;
    if (TVar3 != STATIC_LIBRARY) {
      bVar2 = cmTarget::IsImported(this->Target);
      if (bVar2) {
        pIVar4 = GetImportInfo(this,config);
        MVar6 = Undefined;
        if (pIVar4 != (ImportInfo *)0x0) {
          MVar6 = pIVar4->Managed;
        }
      }
      else {
        paVar1 = &local_40.field_2;
        local_40._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_40,"COMMON_LANGUAGE_RUNTIME","");
        __s = GetProperty(this,&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_40._M_dataplus._M_p != paVar1) {
          operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
        }
        if (__s == (char *)0x0) {
          bVar2 = IsCSharpOnly(this);
          MVar6 = (uint)bVar2 * 2 + Native;
        }
        else {
          local_40._M_dataplus._M_p = (pointer)paVar1;
          sVar5 = strlen(__s);
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,__s,__s + sVar5);
          MVar6 = Managed - (local_40._M_string_length == 0);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_40._M_dataplus._M_p != paVar1) {
            operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
          }
        }
      }
    }
  }
  return MVar6;
}

Assistant:

cmGeneratorTarget::ManagedType cmGeneratorTarget::GetManagedType(
  const std::string& config) const
{
  // Only libraries and executables can be managed targets.
  if (this->GetType() > cmStateEnums::SHARED_LIBRARY) {
    return ManagedType::Undefined;
  }

  if (this->GetType() == cmStateEnums::STATIC_LIBRARY) {
    return ManagedType::Native;
  }

  // Check imported target.
  if (this->IsImported()) {
    if (cmGeneratorTarget::ImportInfo const* info =
          this->GetImportInfo(config)) {
      return info->Managed;
    }
    return ManagedType::Undefined;
  }

  // Check for explicitly set clr target property.
  if (auto* clr = this->GetProperty("COMMON_LANGUAGE_RUNTIME")) {
    return this->CheckManagedType(clr);
  }

  // C# targets are always managed. This language specific check
  // is added to avoid that the COMMON_LANGUAGE_RUNTIME target property
  // has to be set manually for C# targets.
  return this->IsCSharpOnly() ? ManagedType::Managed : ManagedType::Native;
}